

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

void __thiscall
so_5::timers_details::
actual_timer_t<timertt::timer_wheel_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::release(actual_timer_t<timertt::timer_wheel_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
          *this)

{
  reference_counter_type *prVar1;
  basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
  *this_00;
  timer_object<timertt::thread_safety::safe> *ptVar2;
  timer_holder local_10;
  
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
             *)this->m_thread;
  if (this_00 !=
      (basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
       *)0x0) {
    local_10.m_timer = (this->m_timer).m_timer;
    if (local_10.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
      LOCK();
      ((local_10.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i =
           ((local_10.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    timertt::details::
    basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
    ::deactivate(this_00,&local_10);
    if (local_10.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
      LOCK();
      prVar1 = &(local_10.m_timer)->m_references;
      (prVar1->super___atomic_base<unsigned_int>)._M_i =
           (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        (*(local_10.m_timer)->_vptr_timer_object[1])();
      }
      local_10.m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
    }
    this->m_thread =
         (timer_wheel_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
          *)0x0;
    ptVar2 = (this->m_timer).m_timer;
    if (ptVar2 != (timer_object<timertt::thread_safety::safe> *)0x0) {
      LOCK();
      prVar1 = &ptVar2->m_references;
      (prVar1->super___atomic_base<unsigned_int>)._M_i =
           (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        (*ptVar2->_vptr_timer_object[1])();
      }
      (this->m_timer).m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
    }
  }
  return;
}

Assistant:

virtual void
		release() override
			{
				if( m_thread )
				{
					m_thread->deactivate( m_timer );
					m_thread = nullptr;
					m_timer.reset();
				}
			}